

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.hpp
# Opt level: O0

bitpacking_width_t
duckdb::BitpackingPrimitives::FindMinimumBitWidth<short,true,false>(short min_value,short max_value)

{
  short sVar1;
  short in_SI;
  short in_DI;
  short value;
  bitpacking_width_t bitwidth;
  undefined2 local_a;
  undefined1 local_7;
  undefined1 local_1;
  
  sVar1 = NumericLimits<short>::Minimum();
  if (in_DI == sVar1) {
    local_1 = '\x10';
  }
  else {
    local_a = MaxValue<short>(-in_DI,in_SI);
    if (local_a == 0) {
      local_1 = '\0';
    }
    else {
      local_7 = '\x01';
      for (; local_a != 0; local_a = local_a >> 1) {
        local_7 = local_7 + '\x01';
      }
      local_1 = GetEffectiveWidth<short>(local_7);
    }
  }
  return local_1;
}

Assistant:

static bitpacking_width_t FindMinimumBitWidth(T min_value, T max_value) {
		bitpacking_width_t bitwidth;
		T value;

		if (is_signed) {
			if (min_value == NumericLimits<T>::Minimum()) {
				// handle special case of the minimal value, as it cannot be negated like all other values.
				return sizeof(T) * 8;
			} else {
				value = MaxValue((T)-min_value, max_value);
			}
		} else {
			value = max_value;
		}

		if (value == 0) {
			return 0;
		}

		if (is_signed) {
			bitwidth = 1;
		} else {
			bitwidth = 0;
		}

		while (value) {
			bitwidth++;
			value >>= 1;
		}

		bitwidth = GetEffectiveWidth<T>(bitwidth);

		// Assert results are correct
#ifdef DEBUG
		if (bitwidth < sizeof(T) * 8 && bitwidth != 0) {
			if (is_signed) {
				D_ASSERT(max_value <= (T(1) << (bitwidth - 1)) - 1);
				// D_ASSERT(min_value >= (T(-1) * ((T(1) << (bitwidth - 1)) - 1) - 1));
			} else {
				D_ASSERT(max_value <= (T(1) << (bitwidth)) - 1);
			}
		}
#endif
		if (round_to_next_byte) {
			return (bitwidth / 8 + (bitwidth % 8 != 0)) * 8;
		}
		return bitwidth;
	}